

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall cmMakefile::IsSet(cmMakefile *this,string *name)

{
  char *pcVar1;
  bool bVar2;
  string *psVar3;
  
  psVar3 = GetDef(this,name);
  if (((psVar3 == (string *)0x0) || (pcVar1 = (psVar3->_M_dataplus)._M_p, pcVar1 == (char *)0x0)) ||
     (*pcVar1 == '\0')) {
    bVar2 = false;
  }
  else {
    bVar2 = cmSystemTools::IsNOTFOUND((char *)0x14d0e5);
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

bool cmMakefile::IsSet(const std::string& name) const
{
  const char* value = this->GetDefinition(name);
  if (!value) {
    return false;
  }

  if (!*value) {
    return false;
  }

  if (cmSystemTools::IsNOTFOUND(value)) {
    return false;
  }

  return true;
}